

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O0

void __thiscall CKey::Set<unsigned_char*>(CKey *this,uchar *pbegin,uchar *pend,bool fCompressedIn)

{
  long lVar1;
  bool bVar2;
  pointer __dest;
  size_type __n;
  byte in_CL;
  long in_RDX;
  void *in_RSI;
  byte *in_RDI;
  long in_FS_OFFSET;
  CKey *in_stack_ffffffffffffffb8;
  CKey *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX - (long)in_RSI == 0x20) {
    UCharCast(&in_stack_ffffffffffffffb8->fCompressed);
    bVar2 = Check(&in_stack_ffffffffffffffb8->fCompressed);
    if (bVar2) {
      MakeKeyData(in_stack_ffffffffffffffc0);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::operator->((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    *)in_stack_ffffffffffffffb8);
      __dest = std::array<unsigned_char,_32UL>::data
                         ((array<unsigned_char,_32UL> *)in_stack_ffffffffffffffb8);
      std::
      unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
      ::operator->((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                    *)in_stack_ffffffffffffffb8);
      __n = std::array<unsigned_char,_32UL>::size
                      ((array<unsigned_char,_32UL> *)in_stack_ffffffffffffffb8);
      memcpy(__dest,in_RSI,__n);
      *in_RDI = in_CL & 1;
    }
    else {
      ClearKeyData(in_stack_ffffffffffffffb8);
    }
  }
  else {
    ClearKeyData(in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Set(const T pbegin, const T pend, bool fCompressedIn)
    {
        if (size_t(pend - pbegin) != std::tuple_size_v<KeyType>) {
            ClearKeyData();
        } else if (Check(UCharCast(&pbegin[0]))) {
            MakeKeyData();
            memcpy(keydata->data(), (unsigned char*)&pbegin[0], keydata->size());
            fCompressed = fCompressedIn;
        } else {
            ClearKeyData();
        }
    }